

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webrtc_vad.c
# Opt level: O2

int WebRtcVad_ValidRateAndFrameLength(int rate,size_t frame_length)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x10) {
      return -1;
    }
    piVar1 = (int *)((long)sample_rates + lVar2);
    lVar2 = lVar2 + 4;
  } while (*piVar1 != rate);
  uVar3 = 0;
  do {
    uVar3 = uVar3 + 10;
    if (0x1e < uVar3) {
      return -1;
    }
    frame_length = frame_length + (long)(rate / 1000) * -10;
  } while (frame_length != 0);
  return 0;
}

Assistant:

int WebRtcVad_ValidRateAndFrameLength(int rate, size_t frame_length) {
  int return_value = -1;
  size_t i;
  int valid_length_ms;
  size_t valid_length;

  // We only allow 10, 20 or 30 ms frames. Loop through valid frame rates and
  // see if we have a matching pair.
  for (i = 0; i < kRatesSize; i++) {
    if (kValidRates[i] == rate) {
      for (valid_length_ms = 10; valid_length_ms <= kMaxFrameLengthMs;
          valid_length_ms += 10) {
        valid_length = (size_t)(kValidRates[i] / 1000 * valid_length_ms);
        if (frame_length == valid_length) {
          return_value = 0;
          break;
        }
      }
      break;
    }
  }

  return return_value;
}